

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

int STRING_copy(STRING_HANDLE handle,char *s2)

{
  size_t sVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  size_t __size;
  STRING *s1;
  
  iVar4 = 0x1e2;
  if (s2 != (char *)0x0 && handle != (STRING_HANDLE)0x0) {
    pcVar2 = handle->s;
    iVar4 = 0;
    if (pcVar2 != s2) {
      sVar1 = strlen(s2);
      sVar1 = sVar1 + 1;
      __size = 0xffffffffffffffff;
      if (sVar1 != 0) {
        __size = sVar1;
      }
      if ((__size != 0xffffffffffffffff) &&
         (pcVar2 = (char *)realloc(pcVar2,__size), pcVar2 != (char *)0x0)) {
        handle->s = pcVar2;
        memcpy(pcVar2,s2,sVar1);
        return 0;
      }
      p_Var3 = xlogging_get_log_function();
      iVar4 = 0x1f2;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_copy",0x1f0,1,"Failure reallocating value. size=%zu",__size);
      }
    }
  }
  return iVar4;
}

Assistant:

int STRING_copy(STRING_HANDLE handle, const char* s2)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_017: [STRING_copy shall return a nonzero value if any of the supplied parameters are NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        /* Codes_SRS_STRING_07_026: [If the underlying char* refered to by s1 handle is equal to char* s2 than STRING_copy shall be a noop and return 0.] */
        if (s1->s != s2)
        {
            size_t s2Length = strlen(s2);
            size_t realloc_size = safe_add_size_t(s2Length, 1);
            char* temp;
            if (realloc_size == SIZE_MAX ||
                (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
            {
                LogError("Failure reallocating value. size=%zu", realloc_size);
                /* Codes_SRS_STRING_07_027: [STRING_copy shall return a nonzero value if any error is encountered.] */
                result = MU_FAILURE;
            }
            else
            {
                s1->s = temp;
                memmove(s1->s, s2, s2Length + 1);
                result = 0;
            }
        }
        else
        {
            /* Codes_SRS_STRING_07_033: [If overlapping pointer address is given to STRING_copy the behavior is undefined.] */
            result = 0;
        }
    }
    return result;
}